

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O1

int __thiscall cmProcess::GetNextOutputLine(cmProcess *this,string *line,double timeout)

{
  Buffer *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  cmProcessOutput processOutput;
  int length;
  string strdata;
  char *data;
  cmProcessOutput local_85;
  int local_84;
  string local_80;
  double local_60;
  char *local_58;
  string local_50;
  
  local_60 = timeout;
  cmProcessOutput::cmProcessOutput(&local_85,UTF8,0x400);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  this_00 = &this->Output;
  iVar3 = 2;
  do {
    bVar1 = Buffer::GetLine(this_00,line);
    if (bVar1) goto LAB_00328790;
    iVar2 = cmsysProcess_WaitForData(this->Process,&local_58,&local_84,&local_60);
    if (iVar2 == 2) {
      cmProcessOutput::DecodeText(&local_85,local_58,(long)local_84,&local_80,0);
      iVar4 = 0;
      std::vector<char,std::allocator<char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((vector<char,std::allocator<char>> *)this_00,
                 (this->Output).super_vector<char,_std::allocator<char>_>.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_finish);
    }
    else {
      iVar4 = 1;
      if (iVar2 != 0xff) {
        iVar4 = 2;
      }
    }
  } while (iVar4 == 0);
  if (iVar4 == 2) {
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    cmProcessOutput::DecodeText(&local_85,&local_50,&local_80,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    if (local_80._M_string_length != 0) {
      std::vector<char,std::allocator<char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((vector<char,std::allocator<char>> *)this_00,
                 (this->Output).super_vector<char,_std::allocator<char>_>.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_finish,local_80._M_dataplus._M_p,
                 local_80._M_dataplus._M_p + local_80._M_string_length);
    }
    bVar1 = Buffer::GetLast(this_00,line);
    if (!bVar1) {
      iVar2 = cmsysProcess_WaitForExit(this->Process,&local_60);
      iVar3 = 0xff;
      if (iVar2 != 0) {
        iVar3 = cmsysProcess_GetExitValue(this->Process);
        this->ExitValue = iVar3;
        dVar5 = cmsys::SystemTools::GetTime();
        dVar5 = dVar5 - this->StartTime;
        this->TotalTime = (double)(~-(ulong)(dVar5 <= 0.0) & (ulong)dVar5);
        iVar3 = 0;
      }
    }
  }
  else {
    iVar3 = 0xff;
  }
LAB_00328790:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  cmProcessOutput::~cmProcessOutput(&local_85);
  return iVar3;
}

Assistant:

int cmProcess::GetNextOutputLine(std::string& line, double timeout)
{
  cmProcessOutput processOutput(cmProcessOutput::UTF8);
  std::string strdata;
  for (;;) {
    // Look for lines already buffered.
    if (this->Output.GetLine(line)) {
      return cmsysProcess_Pipe_STDOUT;
    }

    // Check for more data from the process.
    char* data;
    int length;
    int p = cmsysProcess_WaitForData(this->Process, &data, &length, &timeout);
    if (p == cmsysProcess_Pipe_Timeout) {
      return cmsysProcess_Pipe_Timeout;
    }
    if (p == cmsysProcess_Pipe_STDOUT) {
      processOutput.DecodeText(data, length, strdata);
      this->Output.insert(this->Output.end(), strdata.begin(), strdata.end());
    } else { // p == cmsysProcess_Pipe_None
      // The process will provide no more data.
      break;
    }
  }
  processOutput.DecodeText(std::string(), strdata);
  if (!strdata.empty()) {
    this->Output.insert(this->Output.end(), strdata.begin(), strdata.end());
  }

  // Look for partial last lines.
  if (this->Output.GetLast(line)) {
    return cmsysProcess_Pipe_STDOUT;
  }

  // No more data.  Wait for process exit.
  if (!cmsysProcess_WaitForExit(this->Process, &timeout)) {
    return cmsysProcess_Pipe_Timeout;
  }

  // Record exit information.
  this->ExitValue = cmsysProcess_GetExitValue(this->Process);
  this->TotalTime = cmSystemTools::GetTime() - this->StartTime;
  // Because of a processor clock scew the runtime may become slightly
  // negative. If someone changed the system clock while the process was
  // running this may be even more. Make sure not to report a negative
  // duration here.
  if (this->TotalTime <= 0.0) {
    this->TotalTime = 0.0;
  }
  //  std::cerr << "Time to run: " << this->TotalTime << "\n";
  return cmsysProcess_Pipe_None;
}